

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O1

UnicodeSet * __thiscall icu_63::UnicodeSet::closeOver(UnicodeSet *this,int32_t attribute)

{
  UBool UVar1;
  UChar32 c;
  UChar32 UVar2;
  int32_t iVar3;
  BreakIterator *iter;
  UnicodeString *pUVar4;
  UnicodeString *pUVar5;
  UChar32 cp;
  undefined4 length;
  UVector *pUVar6;
  undefined8 s;
  int iVar7;
  UChar *full;
  UErrorCode status;
  UnicodeString str;
  Locale root;
  UnicodeSet foldSet;
  _func_int **local_228;
  int32_t local_220;
  UErrorCode local_21c;
  _func_int **local_218;
  _func_int **local_208;
  _func_int **local_1f8;
  _func_int **local_1e8;
  UnicodeString local_1d8;
  USetAdder local_198;
  Locale local_168;
  UnicodeSet local_88;
  
  if (((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
      ((attribute & 6U) != 0)) && ((this->fFlags & 1) == 0)) {
    UnicodeSet(&local_88,this);
    local_1d8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
    local_1d8.fUnion.fStackFields.fLengthAndFlags = 2;
    local_198.add = _set_add;
    local_198.addRange = _set_addRange;
    local_198.addString = _set_addString;
    local_198.remove = (undefined1 *)0x0;
    local_198.removeRange = (undefined1 *)0x0;
    local_198.set = (USet *)&local_88;
    if ((attribute & 2U) != 0) {
      UVector::removeAllElements(local_88.strings);
    }
    local_220 = getRangeCount(this);
    if (0 < local_220) {
      iVar7 = 0;
      do {
        c = getRangeStart(this,iVar7);
        UVar2 = getRangeEnd(this,iVar7);
        if ((attribute & 2U) == 0) {
          if (c <= UVar2) {
            do {
              iVar3 = ucase_toFullLower_63
                                (c,(UCaseContextIterator *)0x0,(void *)0x0,(UChar **)&local_228,1);
              if (-1 < iVar3) {
                if (iVar3 < 0x20) {
                  local_168.super_UObject._vptr_UObject = local_228;
                  UnicodeString::setTo(&local_1d8,'\0',(ConstChar16Ptr *)&local_168,iVar3);
                  local_1e8 = local_168.super_UObject._vptr_UObject;
                  add(&local_88,&local_1d8);
                }
                else {
                  add(&local_88,iVar3);
                }
              }
              iVar3 = ucase_toFullTitle_63
                                (c,(UCaseContextIterator *)0x0,(void *)0x0,(UChar **)&local_228,1);
              if (-1 < iVar3) {
                if (iVar3 < 0x20) {
                  local_168.super_UObject._vptr_UObject = local_228;
                  UnicodeString::setTo(&local_1d8,'\0',(ConstChar16Ptr *)&local_168,iVar3);
                  local_1f8 = local_168.super_UObject._vptr_UObject;
                  add(&local_88,&local_1d8);
                }
                else {
                  add(&local_88,iVar3);
                }
              }
              iVar3 = ucase_toFullUpper_63
                                (c,(UCaseContextIterator *)0x0,(void *)0x0,(UChar **)&local_228,1);
              if (-1 < iVar3) {
                if (iVar3 < 0x20) {
                  local_168.super_UObject._vptr_UObject = local_228;
                  UnicodeString::setTo(&local_1d8,'\0',(ConstChar16Ptr *)&local_168,iVar3);
                  local_208 = local_168.super_UObject._vptr_UObject;
                  add(&local_88,&local_1d8);
                }
                else {
                  add(&local_88,iVar3);
                }
              }
              iVar3 = ucase_toFullFolding_63(c,(UChar **)&local_228,0);
              if (-1 < iVar3) {
                if (iVar3 < 0x20) {
                  local_168.super_UObject._vptr_UObject = local_228;
                  UnicodeString::setTo(&local_1d8,'\0',(ConstChar16Ptr *)&local_168,iVar3);
                  local_218 = local_168.super_UObject._vptr_UObject;
                  add(&local_88,&local_1d8);
                }
                else {
                  add(&local_88,iVar3);
                }
              }
              c = c + 1;
            } while (UVar2 + 1 != c);
          }
        }
        else if (c <= UVar2) {
          do {
            ucase_addCaseClosure_63(c,&local_198);
            c = c + 1;
          } while (UVar2 + 1 != c);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != local_220);
    }
    if ((this->strings != (UVector *)0x0) && (0 < this->strings->count)) {
      if ((attribute & 2U) == 0) {
        Locale::Locale(&local_168,"",(char *)0x0,(char *)0x0,(char *)0x0);
        local_21c = U_ZERO_ERROR;
        iter = BreakIterator::createWordInstance(&local_168,&local_21c);
        if ((local_21c < U_ILLEGAL_ARGUMENT_ERROR) && (pUVar6 = this->strings, 0 < pUVar6->count)) {
          iVar7 = 0;
          do {
            pUVar4 = (UnicodeString *)UVector::elementAt(pUVar6,iVar7);
            pUVar5 = UnicodeString::operator=(&local_1d8,pUVar4);
            UnicodeString::toLower(pUVar5,&local_168);
            add(&local_88,&local_1d8);
            pUVar5 = UnicodeString::operator=(&local_1d8,pUVar4);
            UnicodeString::toTitle(pUVar5,iter,&local_168);
            add(&local_88,&local_1d8);
            pUVar5 = UnicodeString::operator=(&local_1d8,pUVar4);
            UnicodeString::toUpper(pUVar5,&local_168);
            add(&local_88,&local_1d8);
            pUVar4 = UnicodeString::operator=(&local_1d8,pUVar4);
            UnicodeString::foldCase(pUVar4,0);
            add(&local_88,&local_1d8);
            iVar7 = iVar7 + 1;
            pUVar6 = this->strings;
          } while (iVar7 < pUVar6->count);
        }
        if (iter != (BreakIterator *)0x0) {
          (*(iter->super_UObject)._vptr_UObject[1])(iter);
        }
        Locale::~Locale(&local_168);
      }
      else {
        pUVar6 = this->strings;
        if (0 < pUVar6->count) {
          iVar7 = 0;
          do {
            pUVar4 = (UnicodeString *)UVector::elementAt(pUVar6,iVar7);
            UnicodeString::operator=(&local_1d8,pUVar4);
            UnicodeString::foldCase(&local_1d8,0);
            s = local_1d8.fUnion.fStackFields.fBuffer;
            if ((local_1d8.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
              s = local_1d8.fUnion.fFields.fArray;
            }
            if ((local_1d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) != 0) {
              s = (char16_t *)0x0;
            }
            length = local_1d8.fUnion.fFields.fLength;
            if (-1 < local_1d8.fUnion.fStackFields.fLengthAndFlags) {
              length = (int)local_1d8.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            UVar1 = ucase_addStringCaseClosure_63((UChar *)s,length,&local_198);
            if (UVar1 == '\0') {
              add(&local_88,&local_1d8);
            }
            iVar7 = iVar7 + 1;
            pUVar6 = this->strings;
          } while (iVar7 < pUVar6->count);
        }
      }
    }
    operator=(this,&local_88);
    UnicodeString::~UnicodeString(&local_1d8);
    ~UnicodeSet(&local_88);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::closeOver(int32_t attribute) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    if (attribute & (USET_CASE_INSENSITIVE | USET_ADD_CASE_MAPPINGS)) {
        {
            UnicodeSet foldSet(*this);
            UnicodeString str;
            USetAdder sa = {
                foldSet.toUSet(),
                _set_add,
                _set_addRange,
                _set_addString,
                NULL, // don't need remove()
                NULL // don't need removeRange()
            };

            // start with input set to guarantee inclusion
            // USET_CASE: remove strings because the strings will actually be reduced (folded);
            //            therefore, start with no strings and add only those needed
            if (attribute & USET_CASE_INSENSITIVE) {
                foldSet.strings->removeAllElements();
            }

            int32_t n = getRangeCount();
            UChar32 result;
            const UChar *full;

            for (int32_t i=0; i<n; ++i) {
                UChar32 start = getRangeStart(i);
                UChar32 end   = getRangeEnd(i);

                if (attribute & USET_CASE_INSENSITIVE) {
                    // full case closure
                    for (UChar32 cp=start; cp<=end; ++cp) {
                        ucase_addCaseClosure(cp, &sa);
                    }
                } else {
                    // add case mappings
                    // (does not add long s for regular s, or Kelvin for k, for example)
                    for (UChar32 cp=start; cp<=end; ++cp) {
                        result = ucase_toFullLower(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullTitle(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullUpper(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullFolding(cp, &full, 0);
                        addCaseMapping(foldSet, result, full, str);
                    }
                }
            }
            if (strings != NULL && strings->size() > 0) {
                if (attribute & USET_CASE_INSENSITIVE) {
                    for (int32_t j=0; j<strings->size(); ++j) {
                        str = *(const UnicodeString *) strings->elementAt(j);
                        str.foldCase();
                        if(!ucase_addStringCaseClosure(str.getBuffer(), str.length(), &sa)) {
                            foldSet.add(str); // does not map to code points: add the folded string itself
                        }
                    }
                } else {
                    Locale root("");
#if !UCONFIG_NO_BREAK_ITERATION
                    UErrorCode status = U_ZERO_ERROR;
                    BreakIterator *bi = BreakIterator::createWordInstance(root, status);
                    if (U_SUCCESS(status)) {
#endif
                        const UnicodeString *pStr;

                        for (int32_t j=0; j<strings->size(); ++j) {
                            pStr = (const UnicodeString *) strings->elementAt(j);
                            (str = *pStr).toLower(root);
                            foldSet.add(str);
#if !UCONFIG_NO_BREAK_ITERATION
                            (str = *pStr).toTitle(bi, root);
                            foldSet.add(str);
#endif
                            (str = *pStr).toUpper(root);
                            foldSet.add(str);
                            (str = *pStr).foldCase();
                            foldSet.add(str);
                        }
#if !UCONFIG_NO_BREAK_ITERATION
                    }
                    delete bi;
#endif
                }
            }
            *this = foldSet;
        }
    }
    return *this;
}